

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

double qpdf_oh_get_numeric_value(qpdf_data qpdf,qpdf_oh oh)

{
  double dVar1;
  anon_class_1_0_00000001 local_61;
  function<double_(QPDFObjectHandle_&)> local_60;
  double local_40;
  function<double_()> local_38;
  qpdf_oh local_14;
  qpdf_data p_Stack_10;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_40 = 0.0;
  local_14 = oh;
  p_Stack_10 = qpdf;
  return_T<double>(&local_38,&local_40);
  std::function<double(QPDFObjectHandle&)>::function<qpdf_oh_get_numeric_value::__0,void>
            ((function<double(QPDFObjectHandle&)> *)&local_60,&local_61);
  dVar1 = do_with_oh<double>(qpdf,oh,&local_38,&local_60);
  std::function<double_(QPDFObjectHandle_&)>::~function(&local_60);
  std::function<double_()>::~function(&local_38);
  return dVar1;
}

Assistant:

double
qpdf_oh_get_numeric_value(qpdf_data qpdf, qpdf_oh oh)
{
    return do_with_oh<double>(qpdf, oh, return_T<double>(0.0), [](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_numeric_value");
        return o.getNumericValue();
    });
}